

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

void binbuf_print(_binbuf *x)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  if (0 < x->b_n) {
    bVar4 = true;
    lVar3 = 0;
    lVar2 = 0;
    bVar1 = false;
    do {
      if (bVar4) {
        if (bVar1) {
          endpost();
        }
        startpost("");
        bVar1 = true;
      }
      postatom(1,(t_atom *)((long)&x->b_vec->a_type + lVar3));
      bVar4 = *(int *)((long)&x->b_vec->a_type + lVar3) == 4;
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < x->b_n);
    if (bVar1) {
      if ((pd_maininstance.pd_stuff)->st_printhook != (t_printhook)0x0) {
        (*(pd_maininstance.pd_stuff)->st_printhook)("\n");
        return;
      }
      if (sys_printtostderr != 0) {
        fputc(10,_stderr);
        return;
      }
      post("");
      return;
    }
  }
  return;
}

Assistant:

void binbuf_print(const t_binbuf *x)
{
    int i, startedpost = 0, newline = 1;
    for (i = 0; i < x->b_n; i++)
    {
        if (newline)
        {
            if (startedpost) endpost();
            startpost("");
            startedpost = 1;
        }
        postatom(1, x->b_vec + i);
        if (x->b_vec[i].a_type == A_SEMI)
            newline = 1;
        else newline = 0;
    }
    if (startedpost) endpost();
}